

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O3

int it_ptm_read_sample_data(IT_SAMPLE *sample,int last,DUMBFILE *f)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ushort uVar6;
  short sVar7;
  char cVar8;
  long lVar9;
  
  iVar3 = sample->length;
  bVar1 = sample->flags;
  pvVar5 = malloc((long)(iVar3 << (bVar1 >> 1 & 1)));
  sample->data = pvVar5;
  if (pvVar5 == (void *)0x0) {
    iVar3 = -1;
  }
  else {
    if ((bVar1 & 2) == 0) {
      if (0 < iVar3) {
        lVar9 = 0;
        cVar8 = '\0';
        do {
          iVar3 = dumbfile_getc(f);
          cVar2 = (char)iVar3;
          if (iVar3 < 1) {
            cVar2 = '\0';
          }
          cVar8 = cVar8 + cVar2;
          *(char *)((long)sample->data + lVar9) = cVar8;
          lVar9 = lVar9 + 1;
        } while (lVar9 < sample->length);
      }
    }
    else if (0 < iVar3) {
      lVar9 = 0;
      sVar7 = 0;
      do {
        iVar3 = dumbfile_getc(f);
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        iVar4 = dumbfile_getc(f);
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        uVar6 = (char)iVar3 + sVar7;
        sVar7 = (short)(char)iVar4 + uVar6;
        *(ushort *)((long)sample->data + lVar9 * 2) = sVar7 * 0x100 | uVar6 & 0xff;
        lVar9 = lVar9 + 1;
      } while (lVar9 < sample->length);
    }
    iVar3 = dumbfile_error(f);
    iVar3 = -(uint)(last == 0 && iVar3 != 0);
  }
  return iVar3;
}

Assistant:

static int it_ptm_read_sample_data(IT_SAMPLE *sample, int last, DUMBFILE *f)
{
	int32 n;
	int s;

	sample->data = malloc(sample->length * (sample->flags & IT_SAMPLE_16BIT ? 2 : 1));
	if (!sample->data)
		return -1;

	s = 0;

	if (sample->flags & IT_SAMPLE_16BIT) {
		unsigned char a, b;
		for (n = 0; n < sample->length; n++) {
			a = s += (signed char) it_ptm_read_byte(f);
			b = s += (signed char) it_ptm_read_byte(f);
			((short *)sample->data)[n] = a | (b << 8);
		}
	} else {
		for (n = 0; n < sample->length; n++) {
			s += (signed char) it_ptm_read_byte(f);
			((signed char *)sample->data)[n] = s;
		}
	}

	if (dumbfile_error(f) && !last)
		return -1;

	return 0;
}